

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::helpEvent(QGraphicsScene *this,QGraphicsSceneHelpEvent *helpEvent)

{
  bool bVar1;
  uint uVar2;
  QGraphicsScenePrivate *this_00;
  const_iterator o;
  QGraphicsItem **ppQVar3;
  QGraphicsItemPrivate *pQVar4;
  QPoint *in_RSI;
  QGraphicsScenePrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range1;
  QGraphicsItem *toolTipItem;
  QGraphicsScenePrivate *d;
  QPoint point;
  QString text;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> itemsAtPos;
  QString *in_stack_fffffffffffffec8;
  QPoint *in_stack_fffffffffffffed0;
  QGraphicsSceneHelpEvent *in_stack_fffffffffffffed8;
  undefined5 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee5;
  undefined1 in_stack_fffffffffffffee6;
  byte bVar5;
  byte bVar6;
  byte in_stack_fffffffffffffee7;
  int msecDisplayTime;
  uint in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QWidget *in_stack_ffffffffffffff00;
  QString *text_00;
  QWidget *in_stack_ffffffffffffff10;
  QWidget *pQVar7;
  QWidget *pos;
  QGraphicsScenePrivate *scenePos;
  QGraphicsScenePrivate *this_01;
  const_iterator local_40;
  QPointF local_38;
  QPoint local_28;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QGraphicsScene *)0x9d24b5);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  scenePos = this_00;
  local_28 = QGraphicsSceneHelpEvent::screenPos
                       ((QGraphicsSceneHelpEvent *)in_stack_fffffffffffffed0);
  local_38 = QGraphicsSceneHelpEvent::scenePos(in_stack_fffffffffffffed8);
  QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9d2529);
  QGraphicsScenePrivate::itemsAtPosition
            (this_01,in_RSI,(QPointF *)scenePos,in_stack_ffffffffffffff10);
  pQVar7 = (QWidget *)0x0;
  text_00 = &local_20;
  local_40.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed0);
  o = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed0);
  while (bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_40,o), pos = pQVar7,
        bVar1) {
    ppQVar3 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_40);
    in_stack_ffffffffffffff00 = (QWidget *)*ppQVar3;
    pQVar4 = QGraphicsItem::d_func((QGraphicsItem *)0x9d2602);
    uVar2 = (*pQVar4->_vptr_QGraphicsItemPrivate[7])();
    if ((uVar2 & 1) != 0) {
      sendEvent((QGraphicsScene *)this_00,(QGraphicsItem *)in_RDI,
                (QEvent *)
                CONCAT17(in_stack_fffffffffffffee7,
                         CONCAT16(in_stack_fffffffffffffee6,
                                  CONCAT15(in_stack_fffffffffffffee5,in_stack_fffffffffffffee0))));
      bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
      if (bVar1) goto LAB_009d2831;
    }
    QGraphicsItem::toolTip
              ((QGraphicsItem *)
               CONCAT17(in_stack_fffffffffffffee7,
                        CONCAT16(in_stack_fffffffffffffee6,
                                 CONCAT15(in_stack_fffffffffffffee5,in_stack_fffffffffffffee0))));
    bVar1 = QString::isEmpty((QString *)0x9d2663);
    in_stack_fffffffffffffee7 = bVar1 ^ 0xff;
    QString::~QString((QString *)0x9d2676);
    pos = in_stack_ffffffffffffff00;
    if ((in_stack_fffffffffffffee7 & 1) != 0) break;
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_40);
  }
  msecDisplayTime = (int)((ulong)this_00 >> 0x20);
  QString::QString((QString *)0x9d26da);
  QPoint::QPoint(in_stack_fffffffffffffed0);
  in_stack_fffffffffffffef8 = in_stack_fffffffffffffef8 & 0xffffff;
  bVar5 = 0;
  if (pos != (QWidget *)0x0) {
    QGraphicsItem::toolTip
              ((QGraphicsItem *)
               CONCAT17(in_stack_fffffffffffffee7,
                        (uint7)CONCAT15(in_stack_fffffffffffffee5,in_stack_fffffffffffffee0)));
    in_stack_fffffffffffffef8 = CONCAT13(1,(int3)in_stack_fffffffffffffef8);
    bVar1 = QString::isEmpty((QString *)0x9d2730);
    bVar5 = bVar1 ^ 0xff;
  }
  bVar6 = bVar5;
  if ((in_stack_fffffffffffffef8 & 0x1000000) != 0) {
    QString::~QString((QString *)0x9d2754);
  }
  if ((bVar5 & 1) != 0) {
    QGraphicsItem::toolTip
              ((QGraphicsItem *)
               CONCAT17(in_stack_fffffffffffffee7,
                        CONCAT16(bVar6,CONCAT15(bVar5,in_stack_fffffffffffffee0))));
    QString::operator=((QString *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    QString::~QString((QString *)0x9d2792);
    QGraphicsSceneHelpEvent::screenPos((QGraphicsSceneHelpEvent *)in_stack_fffffffffffffed0);
  }
  pQVar7 = QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9d27b8);
  QRect::QRect((QRect *)pQVar7);
  QToolTip::showText((QPoint *)pos,text_00,in_stack_ffffffffffffff00,
                     (QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     msecDisplayTime);
  bVar1 = QString::isEmpty((QString *)0x9d2803);
  (**(code **)((long)*in_RSI + 0x10))(in_RSI,(bVar1 ^ 0xffU) & 1);
  QString::~QString((QString *)0x9d2829);
LAB_009d2831:
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9d283e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::helpEvent(QGraphicsSceneHelpEvent *helpEvent)
{
#if !QT_CONFIG(tooltip)
    Q_UNUSED(helpEvent);
#else
    // Find the first item that does tooltips
    Q_D(QGraphicsScene);
    const QList<QGraphicsItem *> itemsAtPos = d->itemsAtPosition(helpEvent->screenPos(),
                                                                 helpEvent->scenePos(),
                                                                 helpEvent->widget());
    QGraphicsItem *toolTipItem = nullptr;
    for (auto item : itemsAtPos) {
        if (item->d_func()->isProxyWidget()) {
            // if the item is a proxy widget, the event is forwarded to it
            sendEvent(item, helpEvent);
            if (helpEvent->isAccepted())
                return;
        }
        if (!item->toolTip().isEmpty()) {
            toolTipItem = item;
            break;
        }
    }

    // Show or hide the tooltip
    QString text;
    QPoint point;
    if (toolTipItem && !toolTipItem->toolTip().isEmpty()) {
        text = toolTipItem->toolTip();
        point = helpEvent->screenPos();
    }
    QToolTip::showText(point, text, helpEvent->widget());
    helpEvent->setAccepted(!text.isEmpty());
#endif
}